

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::LoadFlagsFromFile(string *path)

{
  bool bVar1;
  string *str;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string contents;
  FILE *flagfile;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  GTestLog *in_stack_ffffffffffffff70;
  char *arg;
  ostream *in_stack_ffffffffffffff80;
  char *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48 [32];
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  GTestLog in_stack_ffffffffffffffec;
  undefined1 delimiter;
  
  std::__cxx11::string::c_str();
  str = (string *)
        posix::FOpen((char *)in_stack_ffffffffffffff70,
                     (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  if (str == (string *)0x0) {
    GTestLog::GTestLog((GTestLog *)0x0,in_stack_ffffffffffffffec.severity_,
                       (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    poVar2 = GTestLog::GetStream((GTestLog *)&stack0xffffffffffffffec);
    poVar2 = std::operator<<(poVar2,"Unable to open file \"");
    in_stack_ffffffffffffff80 = std::operator<<(poVar2,(string *)FLAGS_gtest_flagfile_abi_cxx11_);
    std::operator<<(in_stack_ffffffffffffff80,"\"");
    GTestLog::~GTestLog(in_stack_ffffffffffffff70);
  }
  delimiter = (undefined1)(in_stack_ffffffffffffffec.severity_ >> 0x18);
  ReadEntireFile_abi_cxx11_((FILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  posix::FClose((FILE *)0x182a0e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x182a1f);
  SplitString(str,delimiter,in_stack_ffffffffffffffe0);
  local_68 = (char *)0x0;
  while (arg = local_68,
        pcVar3 = (char *)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&local_60), arg < pcVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_60,(size_type)local_68);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_60,(size_type)local_68);
      std::__cxx11::string::c_str();
      bVar1 = ParseGoogleTestFlag(arg);
      if (!bVar1) {
        g_help_flag = 1;
      }
    }
    local_68 = local_68 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

static void LoadFlagsFromFile(const std::string& path) {
  FILE* flagfile = posix::FOpen(path.c_str(), "r");
  if (!flagfile) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << GTEST_FLAG(flagfile)
                      << "\"";
  }
  std::string contents(ReadEntireFile(flagfile));
  posix::FClose(flagfile);
  std::vector<std::string> lines;
  SplitString(contents, '\n', &lines);
  for (size_t i = 0; i < lines.size(); ++i) {
    if (lines[i].empty())
      continue;
    if (!ParseGoogleTestFlag(lines[i].c_str()))
      g_help_flag = true;
  }
}